

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void_()>::callback<chat::binder>(callback<void_()> *this,binder *func)

{
  callable_impl<void,_chat::binder> *this_00;
  binder local_38;
  
  this_00 = (callable_impl<void,_chat::binder> *)operator_new(0x28);
  local_38.self = func->self;
  local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (func->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (func->context).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  callable_impl<void,_chat::binder>::callable_impl(this_00,&local_38);
  (this->call_ptr).p_ = (callable<void_()> *)this_00;
  booster::atomic_counter::inc();
  if (local_38.context.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.context.
               super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}